

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathColorAlgo.cpp
# Opt level: O0

Color4<double> * Imath_2_5::hsv2rgb_d(Color4<double> *hsv)

{
  double dVar1;
  double *in_RSI;
  Color4<double> *in_RDI;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double t;
  double q;
  double p;
  double f;
  int i;
  double b;
  double g;
  double r;
  double val;
  double sat;
  double hue;
  double local_40;
  double local_38;
  double local_30;
  double local_18;
  
  local_18 = *in_RSI;
  dVar5 = in_RSI[1];
  dVar1 = in_RSI[2];
  local_30 = 0.0;
  local_38 = 0.0;
  local_40 = 0.0;
  if ((local_18 != 1.0) || (NAN(local_18))) {
    local_18 = local_18 * 6.0;
  }
  else {
    local_18 = 0.0;
  }
  dVar2 = Math<double>::floor(local_18);
  local_18 = local_18 - (double)(int)dVar2;
  dVar3 = dVar1 * (1.0 - dVar5);
  dVar4 = dVar1 * (1.0 - dVar5 * local_18);
  dVar5 = dVar1 * (1.0 - dVar5 * (1.0 - local_18));
  switch((int)dVar2) {
  case 0:
    local_40 = dVar3;
    local_38 = dVar5;
    local_30 = dVar1;
    break;
  case 1:
    local_40 = dVar3;
    local_38 = dVar1;
    local_30 = dVar4;
    break;
  case 2:
    local_40 = dVar5;
    local_38 = dVar1;
    local_30 = dVar3;
    break;
  case 3:
    local_40 = dVar1;
    local_38 = dVar4;
    local_30 = dVar3;
    break;
  case 4:
    local_40 = dVar1;
    local_38 = dVar3;
    local_30 = dVar5;
    break;
  case 5:
    local_40 = dVar4;
    local_38 = dVar3;
    local_30 = dVar1;
  }
  Color4<double>::Color4(in_RDI,local_30,local_38,local_40,in_RSI[3]);
  return in_RDI;
}

Assistant:

Color4<double>	
hsv2rgb_d(const Color4<double> &hsv)
{
    double hue = hsv.r;
    double sat = hsv.g;
    double val = hsv.b;

    double   r = 0.0, g = 0.0, b = 0.0;
    
    if (hue == 1) hue = 0;
    else hue *= 6;

    int i = int(Math<double>::floor(hue));
    double f = hue-i;
    double p = val*(1-sat);
    double q = val*(1-(sat*f));
    double t = val*(1-(sat*(1-f)));

    switch (i) 
    {
      case 0: r = val; g = t; b = p; break;
      case 1: r = q; g = val; b = p; break;
      case 2: r = p; g = val; b = t; break;
      case 3: r = p; g = q; b = val; break;
      case 4: r = t; g = p; b = val; break;
      case 5: r = val; g = p; b = q; break;
    }

    return Color4<double>(r,g,b,hsv.a);
}